

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# evutil.c
# Opt level: O0

int evutil_parse_servname(char *servname,char *protocol,addrinfo *hints)

{
  uint16_t uVar1;
  servent *psVar2;
  servent *ent;
  int n;
  addrinfo *hints_local;
  char *protocol_local;
  char *servname_local;
  
  servname_local._4_4_ = parse_numeric_servname(servname);
  if ((int)servname_local._4_4_ < 0) {
    if (((hints->ai_flags & 0x400U) == 0) &&
       (psVar2 = getservbyname(servname,protocol), psVar2 != (servent *)0x0)) {
      uVar1 = ntohs((uint16_t)psVar2->s_port);
      servname_local._4_4_ = (uint)uVar1;
    }
    else {
      servname_local._4_4_ = 0xffffffff;
    }
  }
  return servname_local._4_4_;
}

Assistant:

static int
evutil_parse_servname(const char *servname, const char *protocol,
    const struct evutil_addrinfo *hints)
{
	int n = parse_numeric_servname(servname);
	if (n>=0)
		return n;
#if defined(EVENT__HAVE_GETSERVBYNAME) || defined(_WIN32)
	if (!(hints->ai_flags & EVUTIL_AI_NUMERICSERV)) {
		struct servent *ent = getservbyname(servname, protocol);
		if (ent) {
			return ntohs(ent->s_port);
		}
	}
#endif
	return -1;
}